

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

void __thiscall cplus::utils::List<int_*>::forEach(List<int_*> *this,function<void_(int_*&)> *func)

{
  ListPoint *pLVar1;
  ListPoint *pLVar2;
  ListPoint *pLVar3;
  
  if (this->listBegin != (ListPoint *)0x0) {
    pLVar2 = this->listEnd;
    pLVar3 = this->listBegin;
    do {
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*func->_M_invoker)((_Any_data *)func,&pLVar3->value);
      pLVar1 = (ListPoint *)((ulong)pLVar2 ^ (ulong)pLVar3->nextAndPrev);
      pLVar2 = pLVar3;
      pLVar3 = pLVar1;
    } while (this->listBegin != pLVar1);
  }
  return;
}

Assistant:

void forEach(const std::function<void(T &)> &func) const {
				auto state = listBegin;
				auto preview = listEnd;
				if (state != nullptr) {
					do {
						func(state->get());
						auto next = state->next(preview);
						preview = state;
						state = next;
					} while (state != listBegin);
				}
			}